

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanAnalyzer.cpp
# Opt level: O2

void __thiscall CanAnalyzer::GetRawFrame(CanAnalyzer *this)

{
  pointer puVar1;
  BitState BVar2;
  BitState BVar3;
  undefined8 in_RAX;
  U64 UVar4;
  pointer pBVar5;
  long lVar6;
  undefined8 local_38;
  
  this->mCanError = false;
  this->mRecessiveCount = 0;
  this->mDominantCount = 0;
  pBVar5 = (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar5) {
    (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar5;
  }
  local_38 = in_RAX;
  BVar2 = AnalyzerChannelData::GetBitState();
  BVar3 = CanAnalyzerSettings::Dominant((this->mSettings)._M_ptr);
  if (BVar2 != BVar3) {
    AnalyzerHelpers::Assert("GetFrameOrError assumes we start DOMINANT");
  }
  UVar4 = AnalyzerChannelData::GetSampleNumber();
  this->mStartOfFrame = UVar4;
  lVar6 = 0;
  do {
    if (lVar6 == 0x100) {
      return;
    }
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mCan);
    BVar2 = AnalyzerChannelData::GetBitState();
    BVar3 = CanAnalyzerSettings::Dominant((this->mSettings)._M_ptr);
    if (BVar2 == BVar3) {
      this->mDominantCount = this->mDominantCount + 1;
      this->mRecessiveCount = 0;
      BVar2 = CanAnalyzerSettings::Dominant((this->mSettings)._M_ptr);
      local_38 = CONCAT44(BVar2,(BitState)local_38);
      std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                (&this->mRawBitResults,(BitState *)((long)&local_38 + 4));
      if (this->mDominantCount == 6) {
        this->mCanError = true;
        puVar1 = (this->mSampleOffsets).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        this->mErrorStartingSample = (ulong)puVar1[(int)lVar6 - 4] + this->mStartOfFrame;
        this->mErrorEndingSample = (ulong)puVar1[lVar6 + 1] + this->mStartOfFrame;
        pBVar5 = (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -6;
        (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
        super__Vector_impl_data._M_finish = pBVar5;
LAB_00107425:
        this->mNumRawBits =
             (U32)((ulong)((long)pBVar5 -
                          (long)(this->mRawBitResults).
                                super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
        return;
      }
    }
    else {
      this->mRecessiveCount = this->mRecessiveCount + 1;
      this->mDominantCount = 0;
      BVar2 = CanAnalyzerSettings::Recessive((this->mSettings)._M_ptr);
      local_38 = CONCAT44(local_38._4_4_,BVar2);
      std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                (&this->mRawBitResults,(BitState *)&local_38);
      if (this->mRecessiveCount == 7) {
        pBVar5 = (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        goto LAB_00107425;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void CanAnalyzer::GetRawFrame()
{
    mCanError = false;
    mRecessiveCount = 0;
    mDominantCount = 0;
    mRawBitResults.clear();

    if( mCan->GetBitState() != mSettings->Dominant() )
        AnalyzerHelpers::Assert( "GetFrameOrError assumes we start DOMINANT" );

    mStartOfFrame = mCan->GetSampleNumber();

    U32 i = 0;
    // what we're going to do now is capture a sequence up until we get 7 recessive bits in a row.
    for( ;; )
    {
        if( i > 255 )
        {
            // we are in garbage data most likely, lets get out of here.
            return;
        }

        mCan->AdvanceToAbsPosition( mStartOfFrame + mSampleOffsets[ i ] );
        i++;

        if( mCan->GetBitState() == mSettings->Dominant() )
        {
            // the bit is DOMINANT
            mDominantCount++;
            mRecessiveCount = 0;
            mRawBitResults.push_back( mSettings->Dominant() );

            if( mDominantCount == 6 )
            {
                // we have detected an error.

                mCanError = true;
                mErrorStartingSample = mStartOfFrame + mSampleOffsets[ i - 5 ];
                mErrorEndingSample = mStartOfFrame + mSampleOffsets[ i ];

                // don't use any of these error bits in analysis.
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();

                mNumRawBits = mRawBitResults.size();

                // the channel is currently high.  addvance it to the next start bit.
                // no, don't bother, we want to analyze this packet before we advance.

                break;
            }
        }
        else
        {
            // the bit is RECESSIVE
            mRecessiveCount++;
            mDominantCount = 0;
            mRawBitResults.push_back( mSettings->Recessive() );

            if( mRecessiveCount == 7 )
            {
                // we're done.
                break;
            }
        }
    }

    mNumRawBits = mRawBitResults.size();
}